

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O1

char * google::protobuf::FastInt64ToBufferLeft(int64 i,char *buffer)

{
  char *pcVar1;
  
  if (i < 0) {
    *buffer = '-';
    pcVar1 = FastUInt64ToBufferLeft(-i,buffer + 1);
    return pcVar1;
  }
  pcVar1 = FastUInt64ToBufferLeft(i,buffer);
  return pcVar1;
}

Assistant:

char* FastInt64ToBufferLeft(int64 i, char* buffer) {
  uint64 u = 0;
  if (i < 0) {
    *buffer++ = '-';
    u -= i;
  } else {
    u = i;
  }
  return FastUInt64ToBufferLeft(u, buffer);
}